

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O3

void __thiscall CHud::RenderNetworkIssueNotification(CHud *this)

{
  int iVar1;
  int iVar2;
  CGameClient *pCVar3;
  IGraphics *pIVar4;
  int iVar5;
  long in_FS_OFFSET;
  float fVar6;
  float local_58 [4];
  vec4 local_48;
  CUIRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (this->super_CComponent).m_pClient;
  pIVar4 = pCVar3->m_pGraphics;
  iVar1 = pIVar4->m_ScreenWidth;
  iVar2 = pIVar4->m_ScreenHeight;
  iVar5 = (*(pCVar3->m_pClient->super_IInterface)._vptr_IInterface[0x12])();
  if (0xfa < iVar5) {
    fVar6 = ((float)iVar1 / (float)iVar2) * 300.0 * 0.5 + -15.0 + -5.0 + -10.0 + -4.0;
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])();
    local_30.y = 2.0;
    local_30.w = 14.0;
    local_30.h = 14.0;
    local_48.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x0;
    local_48.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x0;
    local_48.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x0;
    local_48.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3e99999a;
    local_30.x = fVar6;
    CUIRect::Draw(&local_30,&local_48,1.0,0xf);
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x13])
              (pIVar4,(ulong)(uint)g_pData->m_aImages[0x15].m_Id.m_Id);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17])
              ();
    CRenderTools::SelectSprite(&((this->super_CComponent).m_pClient)->m_RenderTools,0xa3,0,0,0);
    local_58[0] = fVar6 + 2.0;
    local_58[1] = 4.0;
    local_58[2] = 10.0;
    local_58[3] = 10.0;
    pIVar4 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar4->super_IInterface)._vptr_IInterface[0x1d])(pIVar4,local_58,1);
    (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18])
              ();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderNetworkIssueNotification()
{
	float x = 300.0f*Graphics()->ScreenAspect()/2.0f - 15.0f;
	float FontSize = 10.0f;

	// render network indicator when 2/5 and under
	const int NetScore = Client()->GetInputtimeMarginStabilityScore();
	if(NetScore > 250)
	{
		float Margin = 2.0f;
		x = x-5.0f-FontSize-Margin*2;
		Graphics()->BlendNormal();
		CUIRect RectBox = {x, 4-Margin, FontSize+2*Margin, FontSize+2*Margin};
		vec4 Color = vec4(0.0f, 0.0f, 0.0f, 0.3f);
		RectBox.Draw(Color, 1.0f);
		Graphics()->TextureSet(g_pData->m_aImages[IMAGE_NETWORKICONS].m_Id);
		Graphics()->QuadsBegin();
		RenderTools()->SelectSprite(SPRITE_NETWORK_BAD);
		IGraphics::CQuadItem QuadItem(x+Margin, 4, FontSize, FontSize);
		Graphics()->QuadsDrawTL(&QuadItem, 1);
		Graphics()->QuadsEnd();
	}
}